

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  ushort *puVar1;
  FeatureSet *from;
  Descriptor *pDVar2;
  string *psVar3;
  MethodOptions *this_00;
  MethodOptions *pMVar4;
  FeatureSet *this_01;
  Arena *pAVar5;
  string_view value;
  AlphaNum local_48;
  
  puVar1 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar1;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar1 + ~value._M_len);
  pAVar5 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar5);
  pDVar2 = input_type(this);
  if ((pDVar2->field_0x1 & 2) == 0) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pAVar5 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.input_type_,".",pAVar5);
  }
  psVar3 = MethodDescriptorProto::_internal_mutable_input_type_abi_cxx11_(proto);
  pDVar2 = input_type(this);
  local_48.piece_._M_str = (pDVar2->all_names_).payload_;
  local_48.piece_._M_len = (size_t)*(ushort *)(local_48.piece_._M_str + 2);
  local_48.piece_._M_str = local_48.piece_._M_str + ~local_48.piece_._M_len;
  absl::lts_20250127::StrAppend(psVar3,&local_48);
  pDVar2 = output_type(this);
  if ((pDVar2->field_0x1 & 2) == 0) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar5 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.output_type_,".",pAVar5);
  }
  psVar3 = MethodDescriptorProto::_internal_mutable_output_type_abi_cxx11_(proto);
  pDVar2 = output_type(this);
  local_48.piece_._M_str = (pDVar2->all_names_).payload_;
  local_48.piece_._M_len = (size_t)*(ushort *)(local_48.piece_._M_str + 2);
  local_48.piece_._M_str = local_48.piece_._M_str + ~local_48.piece_._M_len;
  absl::lts_20250127::StrAppend(psVar3,&local_48);
  pMVar4 = this->options_;
  if (pMVar4 != (MethodOptions *)_MethodOptions_default_instance_) {
    this_00 = MethodDescriptorProto::mutable_options(proto);
    MethodOptions::CopyFrom(this_00,pMVar4);
  }
  if (this->client_streaming_ == true) {
    (proto->field_0)._impl_.client_streaming_ = true;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x10;
  }
  if (this->server_streaming_ == true) {
    (proto->field_0)._impl_.server_streaming_ = true;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x20;
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pMVar4 = MethodDescriptorProto::mutable_options(proto);
    this_01 = MethodOptions::mutable_features(pMVar4);
    FeatureSet::CopyFrom(this_01,from);
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  absl::StrAppend(proto->mutable_input_type(), input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  absl::StrAppend(proto->mutable_output_type(), output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}